

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O2

int KINSetJacTimesVecSysFn(void *kinmem,KINSysFn jtimesSysFn)

{
  int iVar1;
  KINMem kin_mem;
  KINLsMem kinls_mem;
  
  kin_mem = (KINMem)0x0;
  kinls_mem = (KINLsMem)0x0;
  iVar1 = kinLs_AccessLMem(kinmem,"KINSetJacTimesVecSysFn",&kin_mem,&kinls_mem);
  if (iVar1 == 0) {
    if (kinls_mem->jtimesDQ == 0) {
      iVar1 = -3;
      KINProcessError(kin_mem,-3,0x170,"KINSetJacTimesVecSysFn",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"Internal finite-difference Jacobian-vector product is disabled.");
    }
    else {
      if (jtimesSysFn == (KINSysFn)0x0) {
        kinls_mem->jt_func = kin_mem->kin_func;
      }
      else {
        kinls_mem->jt_func = jtimesSysFn;
      }
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int KINSetJacTimesVecSysFn(void* kinmem, KINSysFn jtimesSysFn)
{
  int retval;
  KINMem kin_mem     = NULL;
  KINLsMem kinls_mem = NULL;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* check if using internal finite difference approximation */
  if (!(kinls_mem->jtimesDQ))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Internal finite-difference Jacobian-vector product is disabled.");
    return (KINLS_ILL_INPUT);
  }

  /* store function pointers for system function (NULL implies use kin_func) */
  if (jtimesSysFn != NULL) { kinls_mem->jt_func = jtimesSysFn; }
  else { kinls_mem->jt_func = kin_mem->kin_func; }

  return (KINLS_SUCCESS);
}